

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_tree.cpp
# Opt level: O1

idx_t duckdb::CreateTreeRecursive<duckdb::ProfilingNode>
                (RenderTree *result,ProfilingNode *op,idx_t x,idx_t y)

{
  ProfilingInfo *this;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double params;
  bool bVar2;
  pointer pRVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  mapped_type *this_00;
  _Alloc_hider _Var5;
  unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true> node;
  string cardinality;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  idx_t width;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extra_info;
  _Head_base<0UL,_duckdb::RenderTreeNode_*,_false> local_150;
  _Head_base<0UL,_duckdb::RenderTreeNode_*,_false> local_148;
  _Head_base<0UL,_duckdb::RenderTreeNode_*,_false> local_140;
  idx_t local_138;
  idx_t local_130;
  string local_128;
  string local_108;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  _Any_data local_a8;
  code *local_98;
  __node_base_ptr *pp_Stack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined4 local_70;
  undefined8 local_68;
  __node_base_ptr ap_Stack_60 [2];
  string local_50;
  
  this = &op->profiling_info;
  local_a8._M_unused._M_object = (long *)0x0;
  local_a8._8_8_ = 0;
  local_98 = (code *)0x0;
  pp_Stack_90 = ap_Stack_60;
  local_88 = 1;
  local_80 = 0;
  uStack_78 = 0;
  local_70 = 0x3f800000;
  local_68 = 0;
  ap_Stack_60[0] = (__node_base_ptr)0x0;
  local_138 = y;
  local_130 = x;
  bVar2 = ProfilingInfo::Enabled(&this->settings,EXTRA_INFO);
  if (bVar2) {
    __x = &(op->profiling_info).extra_info;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_a8,
                (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)__x);
    if ((_Any_data *)__x != &local_a8) {
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&pp_Stack_90,&(op->profiling_info).extra_info.map_idx._M_h);
    }
  }
  paVar1 = &local_c8.field_2;
  local_c8.field_2._M_allocated_capacity._0_4_ = 0x52455551;
  local_c8.field_2._M_allocated_capacity._4_2_ = 0x59;
  local_c8._M_string_length = 5;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  if (op->depth != 0) {
    ProfilingInfo::GetMetricAsString_abi_cxx11_(&local_128,this,OPERATOR_TYPE);
    ::std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
        &local_128.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_));
    }
  }
  make_uniq<duckdb::RenderTreeNode,std::__cxx11::string&,duckdb::InsertionOrderPreservingMap<std::__cxx11::string>&>
            ((duckdb *)&local_150,&local_c8,
             (InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a8);
  bVar2 = ProfilingInfo::Enabled(&this->settings,OPERATOR_CARDINALITY);
  if (bVar2) {
    ProfilingInfo::GetMetricAsString_abi_cxx11_(&local_128,this,OPERATOR_CARDINALITY);
    pRVar3 = unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>::
             operator->((unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>
                         *)&local_150);
    local_108.field_2._M_allocated_capacity._0_4_ = 0x61635f5f;
    local_108.field_2._M_local_buf[4] = 'r';
    local_108.field_2._M_allocated_capacity._5_2_ = 0x6964;
    local_108.field_2._M_local_buf[7] = 'n';
    local_108.field_2._8_7_ = 0x5f5f7974696c61;
    local_108._M_string_length = 0xf;
    local_108.field_2._M_local_buf[0xf] = '\0';
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    pbVar4 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](&pRVar3->extra_text,&local_108);
    ::std::__cxx11::string::_M_assign((string *)pbVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
        &local_128.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_));
    }
  }
  bVar2 = ProfilingInfo::Enabled(&this->settings,OPERATOR_TIMING);
  if (bVar2) {
    local_128._M_dataplus._M_p._0_1_ = 9;
    this_00 = std::__detail::
              _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::at((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)&(op->profiling_info).metrics,(key_type *)&local_128);
    params = Value::GetValue<double>(this_00);
    local_108.field_2._M_allocated_capacity._0_4_ = 0x66322e25;
    local_108._M_string_length = 4;
    local_108.field_2._M_local_buf[4] = '\0';
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    Exception::ConstructMessage<double>(&local_128,&local_108,params);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    local_e8[0] = local_d8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_e8,
               CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_),
               local_128._M_string_length +
               CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_));
    ::std::__cxx11::string::append((char *)local_e8);
    pRVar3 = unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>::
             operator->((unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>
                         *)&local_150);
    local_50.field_2._M_allocated_capacity = 0x676e696d69745f5f;
    local_50.field_2._8_2_ = 0x5f5f;
    local_50._M_string_length = 10;
    local_50.field_2._M_local_buf[10] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pbVar4 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](&pRVar3->extra_text,&local_50);
    ::std::__cxx11::string::operator=((string *)pbVar4,(string *)local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_) !=
        &local_128.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_128._M_dataplus._M_p._1_7_,local_128._M_dataplus._M_p._0_1_));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&pp_Stack_90);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_a8);
  if ((op->children).
      super_vector<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (op->children).
      super_vector<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_140._M_head_impl = local_150._M_head_impl;
    local_150._M_head_impl = (RenderTreeNode *)0x0;
    RenderTree::SetNode(result,local_130,local_138,
                        (unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>
                         *)&local_140);
    if (local_140._M_head_impl != (RenderTreeNode *)0x0) {
      std::default_delete<duckdb::RenderTreeNode>::operator()
                ((default_delete<duckdb::RenderTreeNode> *)&local_140,local_140._M_head_impl);
    }
    local_140._M_head_impl = (RenderTreeNode *)0x0;
    _Var5._M_p = &DAT_00000001;
  }
  else {
    local_c8._M_dataplus._M_p = (pointer)0x0;
    local_98 = (code *)0x0;
    pp_Stack_90 = (__node_base_ptr *)0x0;
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    local_a8._M_unused._M_object = operator_new(0x28);
    *(idx_t **)local_a8._M_unused._0_8_ = &local_130;
    *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
     ((long)local_a8._M_unused._0_8_ + 8) = &local_c8;
    *(idx_t **)((long)local_a8._M_unused._0_8_ + 0x10) = &local_138;
    *(_Head_base<0UL,_duckdb::RenderTreeNode_*,_false> **)((long)local_a8._M_unused._0_8_ + 0x18) =
         &local_150;
    *(RenderTree **)((long)local_a8._M_unused._0_8_ + 0x20) = result;
    pp_Stack_90 = (__node_base_ptr *)
                  std::
                  _Function_handler<void_(const_duckdb::ProfilingNode_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/render_tree.cpp:137:39)>
                  ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(const_duckdb::ProfilingNode_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/render_tree.cpp:137:39)>
               ::_M_manager;
    anon_unknown.dwarf_990f2c::TreeChildrenIterator::Iterate<duckdb::ProfilingNode>
              (op,(function<void_(const_duckdb::ProfilingNode_&)> *)&local_a8);
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,3);
    }
    local_148._M_head_impl = local_150._M_head_impl;
    local_150._M_head_impl = (RenderTreeNode *)0x0;
    RenderTree::SetNode(result,local_130,local_138,
                        (unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>
                         *)&local_148);
    if (local_148._M_head_impl != (RenderTreeNode *)0x0) {
      std::default_delete<duckdb::RenderTreeNode>::operator()
                ((default_delete<duckdb::RenderTreeNode> *)&local_148,local_148._M_head_impl);
    }
    local_148._M_head_impl = (RenderTreeNode *)0x0;
    _Var5._M_p = local_c8._M_dataplus._M_p;
  }
  if (local_150._M_head_impl != (RenderTreeNode *)0x0) {
    std::default_delete<duckdb::RenderTreeNode>::operator()
              ((default_delete<duckdb::RenderTreeNode> *)&local_150,local_150._M_head_impl);
  }
  return (idx_t)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var5._M_p;
}

Assistant:

static idx_t CreateTreeRecursive(RenderTree &result, const T &op, idx_t x, idx_t y) {
	auto node = CreateNode(op);

	if (!TreeChildrenIterator::HasChildren(op)) {
		result.SetNode(x, y, std::move(node));
		return 1;
	}
	idx_t width = 0;
	// render the children of this node
	TreeChildrenIterator::Iterate<T>(op, [&](const T &child) {
		auto child_x = x + width;
		auto child_y = y + 1;
		node->AddChildPosition(child_x, child_y);
		width += CreateTreeRecursive<T>(result, child, child_x, child_y);
	});
	result.SetNode(x, y, std::move(node));
	return width;
}